

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmSignature.cpp
# Opt level: O0

void __thiscall Wasm::WasmSignature::SetResult(WasmSignature *this,Local type,uint32 index)

{
  uint32 uVar1;
  WasmCompilationException *this_00;
  WasmType **ppWVar2;
  uint32 index_local;
  Local type_local;
  WasmSignature *this_local;
  
  uVar1 = GetResultCount(this);
  if (uVar1 <= index) {
    this_00 = (WasmCompilationException *)__cxa_allocate_exception(8);
    uVar1 = GetResultCount(this);
    WasmCompilationException::WasmCompilationException
              (this_00,L"Result %u out of range (max %u)",(ulong)index,(ulong)uVar1);
    __cxa_throw(this_00,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  ppWVar2 = Memory::WriteBarrierPtr::operator_cast_to_WasmType__
                      ((WriteBarrierPtr *)&this->m_results);
  (*ppWVar2)[index] = type;
  return;
}

Assistant:

void WasmSignature::SetResult(Local type, uint32 index)
{
    if (index >= GetResultCount())
    {
        throw WasmCompilationException(_u("Result %u out of range (max %u)"), index, GetResultCount());
    }
    m_results[index] = type;
}